

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

void __thiscall
soplex::SoPlexBase<double>::_ratrecAndOrRatfac
          (SoPlexBase<double> *this,int *minIRRoundsRemaining,int *lastStallIterations,
          int *numberOfIterations,bool *factorSolNewBasis,int *nextRatrec,
          Rational *errorCorrectionFactor,Rational *errorCorrection,Rational *maxViolation,
          SolRational *sol,bool *primalFeasible,bool *dualFeasible,bool *stoppedTime,
          bool *stoppedIter,bool *error,bool *breakAfter,bool *continueAfter)

{
  bool bVar1;
  Verbosity VVar2;
  Settings *pSVar3;
  bool bVar4;
  int iVar5;
  Verbosity old_verbosity_2;
  byte bVar6;
  byte bVar7;
  Verbosity old_verbosity;
  type t;
  longlong local_38;
  
  bVar6 = 0;
  *breakAfter = false;
  *continueAfter = false;
  pSVar3 = this->_currentSettings;
  if (pSVar3->_boolParamValues[3] == true) {
    if ((*lastStallIterations < pSVar3->_intParamValues[0x15]) || (this->_hasBasis != true)) {
      bVar6 = 0;
    }
    else {
      bVar6 = *factorSolNewBasis;
    }
  }
  if (pSVar3->_boolParamValues[5] == true) {
    bVar7 = *nextRatrec <= *numberOfIterations | bVar6;
  }
  else {
    bVar7 = 0;
  }
  bVar1 = pSVar3->_boolParamValues[0xc];
  boost::
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)errorCorrection,
               (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)errorCorrectionFactor);
  if ((bVar7 & 1) != 0) {
    local_38 = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>(&t.m_backend,&local_38,(type *)0x0);
    iVar5 = boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::compare(&maxViolation->m_backend,&t.m_backend);
    if ((t.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (t.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(t.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)t.m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((t.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (t.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(t.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)t.m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if (0 < iVar5) {
      VVar2 = (this->spxout).m_verbosity;
      if (2 < (int)VVar2) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Performing rational reconstruction . . .\n",0x29);
        (this->spxout).m_verbosity = VVar2;
      }
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)maxViolation,
                   (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)errorCorrection);
      invert(maxViolation);
      bVar4 = _reconstructSolutionRational
                        (this,sol,&this->_basisStatusRows,&this->_basisStatusCols,maxViolation);
      if (bVar4) {
        VVar2 = (this->spxout).m_verbosity;
        if (2 < (int)VVar2) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Tolerances reached.\n",0x14);
          (this->spxout).m_verbosity = VVar2;
        }
        *primalFeasible = true;
        *dualFeasible = true;
        if ((bVar1 == false) || (this->_hasBasis != false)) goto LAB_00324aa2;
      }
      *nextRatrec = (int)((double)*numberOfIterations *
                         this->_currentSettings->_realParamValues[0x11]) + 1;
    }
  }
  if (bVar6 == 0 && bVar1 == false) {
LAB_0032497f:
    if (bVar1 == false) {
      return;
    }
    if (this->_hasBasis != false) {
      return;
    }
  }
  else {
    local_38 = 0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>(&t.m_backend,&local_38,(type *)0x0);
    iVar5 = boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::compare(&maxViolation->m_backend,&t.m_backend);
    if ((t.m_backend.m_value.den.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (t.m_backend.m_value.den.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(t.m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)t.m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if ((t.m_backend.m_value.num.m_backend.
         super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
         .m_internal == false) &&
       (t.m_backend.m_value.num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_alias == false)) {
      operator_delete(t.m_backend.m_value.num.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.ld.data,
                      (ulong)t.m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data.ld.capacity << 3);
    }
    if (iVar5 < 1) goto LAB_0032497f;
  }
  VVar2 = (this->spxout).m_verbosity;
  if (2 < (int)VVar2) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Performing rational factorization . . .\n",0x28);
    (this->spxout).m_verbosity = VVar2;
  }
  factorizeColumnRational
            (this,sol,&this->_basisStatusRows,&this->_basisStatusCols,stoppedTime,stoppedIter,error,
             (bool *)&t);
  *factorSolNewBasis = false;
  if (*stoppedTime == true) {
    VVar2 = (this->spxout).m_verbosity;
    if ((int)VVar2 < 3) {
      return;
    }
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],"Stopped rational factorization.\n",0x20);
    (this->spxout).m_verbosity = VVar2;
    return;
  }
  if (*error == true) {
    *error = false;
    return;
  }
  if (t.m_backend.m_value.num.m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.ld.capacity._0_1_ == '\x01') {
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Tolerances reached.\n",0x14);
      (this->spxout).m_verbosity = VVar2;
    }
    *primalFeasible = true;
    *dualFeasible = true;
  }
  else {
    if (this->_currentSettings->_boolParamValues[7] != true) {
      return;
    }
    VVar2 = (this->spxout).m_verbosity;
    if (2 < (int)VVar2) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(&this->spxout,"Jumping to exact basic solution.\n");
      (this->spxout).m_verbosity = VVar2;
    }
    *minIRRoundsRemaining = *minIRRoundsRemaining + 1;
    breakAfter = continueAfter;
  }
LAB_00324aa2:
  *breakAfter = true;
  return;
}

Assistant:

void SoPlexBase<R>::_ratrecAndOrRatfac(
   int& minIRRoundsRemaining,
   int& lastStallIterations,
   int& numberOfIterations,
   bool& factorSolNewBasis,
   int& nextRatrec,
   const Rational& errorCorrectionFactor,
   Rational& errorCorrection,
   Rational& maxViolation,
   SolRational& sol,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error,
   bool& breakAfter,
   bool& continueAfter)
{

   ///@todo precision-boosting numberOfIterations is not the best name
   // It is supposed to designate either the number of refinements (when we use iterative refinement) or
   // the number of precision boosts (when not using iterative refinement)
   // numberOfSpecificIterations maybe?

   breakAfter    = false;
   continueAfter = false;

   // decide whether to perform rational reconstruction and/or factorization
   bool forcebasic    = boolParam(SoPlexBase<R>::FORCEBASIC);
   bool performRatfac = boolParam(SoPlexBase<R>::RATFAC)
                        && lastStallIterations >= intParam(SoPlexBase<R>::RATFAC_MINSTALLS) && _hasBasis
                        && factorSolNewBasis;
   bool performRatrec = boolParam(SoPlexBase<R>::RATREC)
                        && (numberOfIterations >= nextRatrec || performRatfac);

   // if we want to force the solution to be basic we need to turn rational factorization on
   performRatfac = performRatfac || forcebasic;

   // attempt rational reconstruction
   errorCorrection *= errorCorrectionFactor;

   if(performRatrec && maxViolation > 0)
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational reconstruction . . .\n");

      maxViolation *= errorCorrection; // only used for sign check later
      invert(maxViolation);

      if(_reconstructSolutionRational(sol, _basisStatusRows, _basisStatusCols, maxViolation))
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;

         if(_hasBasis || !forcebasic)
         {
            breakAfter = true;
            return;
         }
      }

      nextRatrec = int(numberOfIterations * realParam(SoPlexBase<R>::RATREC_FREQ)) + 1;

      if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
      {
         SPxOut::debug(this, "Next rational reconstruction after refinement {}.\n", nextRatrec);
      }
      else
      {
         assert(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
         SPxOut::debug(this, "Next rational reconstruction after precision boost {} \n", nextRatrec);
      }
   }

   // solve basis systems exactly
   if((performRatfac && maxViolation > 0) || (!_hasBasis && forcebasic))
   {
      SPX_MSG_INFO1(spxout, spxout << "Performing rational factorization . . .\n");

      bool optimal;
      factorizeColumnRational(sol, _basisStatusRows, _basisStatusCols, stoppedTime, stoppedIter, error,
                              optimal);
      factorSolNewBasis = false;

      if(stoppedTime)
      {
         SPX_MSG_INFO1(spxout, spxout << "Stopped rational factorization.\n");
      }
      else if(error)
      {
         // message was already printed; reset error flag and continue without factorization
         error = false;
      }
      else if(optimal)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         primalFeasible = true;
         dualFeasible = true;
         breakAfter = true;
         return;
      }
      else if(boolParam(SoPlexBase<R>::RATFACJUMP))
      {
         SPX_MSG_INFO1(spxout, spxout << "Jumping to exact basic solution.\n");
         minIRRoundsRemaining++;
         continueAfter = true;
         return;
      }
   }
}